

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

uint Ivy_CutGetTruth_rec(Ivy_Man_t *p,int Leaf,int *pNums,int nNums)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  Ivy_Obj_t *pIVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  if (0 < nNums) {
    uVar7 = (ulong)(uint)nNums;
  }
  while( true ) {
    uVar4 = 0;
    while (uVar7 != uVar4) {
      uVar1 = uVar4 + 1;
      puVar2 = (uint *)(pNums + uVar4);
      uVar4 = uVar1;
      if (*puVar2 == Leaf) {
        return *(uint *)(&UNK_0081230c + uVar1 * 4);
      }
    }
    pIVar5 = Ivy_ManObj(p,Leaf >> 8);
    uVar3 = *(uint *)&pIVar5->field_0x8 & 0xf;
    if (uVar3 != 4) break;
    pIVar5 = pIVar5->pFanin0;
    if (((ulong)pIVar5 & 1) != 0) {
      __assert_fail("!Ivy_ObjFaninC0(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x23c,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
    }
    if (pIVar5 == (Ivy_Obj_t *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = pIVar5->Id << 8;
    }
    Leaf = (Leaf & 0xffU) + 1 | uVar3;
  }
  if (uVar3 - 5 < 3) {
    if (pIVar5->pFanin0 == (Ivy_Obj_t *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(int *)((ulong)pIVar5->pFanin0 & 0xfffffffffffffffe) << 8;
    }
    uVar3 = Ivy_CutGetTruth_rec(p,uVar3 | Leaf & 0xffU,pNums,nNums);
    uVar3 = -(*(uint *)&pIVar5->pFanin0 & 1) ^ uVar3;
    if ((*(uint *)&pIVar5->field_0x8 & 0xf) != 7) {
      if (pIVar5->pFanin1 == (Ivy_Obj_t *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(int *)((ulong)pIVar5->pFanin1 & 0xfffffffffffffffe) << 8;
      }
      uVar6 = Ivy_CutGetTruth_rec(p,uVar6 | Leaf & 0xffU,pNums,nNums);
      uVar3 = uVar3 & (-(*(uint *)&pIVar5->pFanin1 & 1) ^ uVar6);
    }
    return uVar3;
  }
  __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                ,0x240,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
}

Assistant:

unsigned Ivy_CutGetTruth_rec( Ivy_Man_t * p, int Leaf, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( Leaf == pNums[i] )
            return uMasks[i];
    pObj = Ivy_ManObj( p, Ivy_LeafId(Leaf) );
    if ( Ivy_ObjIsLatch(pObj) )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) + 1 );
        return Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    }
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) );
    uTruth0 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId1(pObj), Ivy_LeafLat(Leaf) );
    uTruth1 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}